

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

int __thiscall
TPZMatrix<std::complex<long_double>_>::Decompose_LDLt(TPZMatrix<std::complex<long_double>_> *this)

{
  longdouble lVar1;
  complex<long_double> a;
  int iVar2;
  bool bVar3;
  int64_t iVar4;
  int64_t iVar5;
  long lVar6;
  long lVar7;
  TPZBaseMatrix *in_RDI;
  complex<long_double> val;
  int k_1;
  complex<long_double> sum_1;
  int l;
  complex<long_double> tmp;
  int k;
  complex<long_double> sum;
  int j;
  int dim;
  complex<long_double> *pcVar8;
  undefined2 uVar9;
  undefined6 in_stack_fffffffffffffcc2;
  undefined8 in_stack_fffffffffffffd00;
  undefined8 in_stack_fffffffffffffd08;
  undefined8 in_stack_fffffffffffffd10;
  undefined8 in_stack_fffffffffffffd18;
  undefined1 local_2a8 [32];
  undefined1 local_288 [32];
  undefined1 local_268 [64];
  undefined1 local_228 [108];
  int local_1bc;
  complex<long_double> local_1b8;
  int local_18c;
  undefined8 local_188;
  undefined8 local_180;
  undefined8 local_178;
  undefined8 local_170;
  undefined8 local_168;
  undefined8 local_160;
  undefined8 local_158;
  undefined8 local_150;
  char *in_stack_fffffffffffffeb8;
  char *in_stack_fffffffffffffec0;
  undefined1 local_128 [32];
  undefined1 local_108 [32];
  undefined1 local_e8 [64];
  undefined1 local_a8 [108];
  int local_3c;
  complex<long_double> local_38;
  int local_18;
  int local_14;
  
  if ((in_RDI->fDecomposed == '\0') || (in_RDI->fDecomposed == '\x04')) {
    if (in_RDI->fDecomposed != '\0') {
      return 4;
    }
  }
  else {
    Error(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  }
  iVar4 = TPZBaseMatrix::Rows(in_RDI);
  iVar5 = TPZBaseMatrix::Cols(in_RDI);
  if (iVar4 != iVar5) {
    Error(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  }
  iVar4 = TPZBaseMatrix::Rows(in_RDI);
  local_14 = (int)iVar4;
  for (local_18 = 0; local_18 < local_14; local_18 = local_18 + 1) {
    lVar1 = (longdouble)0;
    pcVar8 = SUB108(lVar1,0);
    uVar9 = (undefined2)((unkuint10)lVar1 >> 0x40);
    std::complex<long_double>::complex(&local_38,lVar1,lVar1);
    for (local_3c = 0; local_3c < local_18; local_3c = local_3c + 1) {
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])
                (local_a8,in_RDI,(long)local_3c,(long)local_3c);
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])
                (local_e8,in_RDI,(long)local_3c,(long)local_18);
      std::conj<long_double>((complex<long_double> *)in_RDI);
      std::operator*((complex<long_double> *)CONCAT62(in_stack_fffffffffffffcc2,uVar9),pcVar8);
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])
                (local_108,in_RDI,(long)local_3c,(long)local_18);
      std::operator*((complex<long_double> *)CONCAT62(in_stack_fffffffffffffcc2,uVar9),pcVar8);
      std::complex<long_double>::operator+=
                ((complex<long_double> *)CONCAT62(in_stack_fffffffffffffcc2,uVar9),pcVar8);
    }
    lVar6 = (long)local_18;
    lVar7 = (long)local_18;
    (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])
              (&stack0xfffffffffffffeb8,in_RDI,(long)local_18,(long)local_18);
    std::operator-((complex<long_double> *)CONCAT62(in_stack_fffffffffffffcc2,uVar9),pcVar8);
    (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,lVar6,lVar7,local_128);
    (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])
              (&local_168,in_RDI,(long)local_18,(long)local_18);
    local_188 = local_168;
    local_180 = local_160;
    local_178 = local_158;
    local_170 = local_150;
    in_stack_fffffffffffffcc2 = (undefined6)((ulong)local_160 >> 0x10);
    a._M_value._8_8_ = in_stack_fffffffffffffd08;
    a._M_value._0_8_ = in_stack_fffffffffffffd00;
    a._M_value._16_8_ = in_stack_fffffffffffffd10;
    a._M_value._24_8_ = in_stack_fffffffffffffd18;
    bVar3 = IsZero(a);
    iVar2 = local_18;
    if (bVar3) {
      Error(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      iVar2 = local_18;
    }
    while (local_18c = iVar2 + 1, local_18c < local_14) {
      lVar1 = (longdouble)0;
      pcVar8 = SUB108(lVar1,0);
      uVar9 = (undefined2)((unkuint10)lVar1 >> 0x40);
      std::complex<long_double>::complex(&local_1b8,lVar1,lVar1);
      for (local_1bc = 0; local_1bc < local_18; local_1bc = local_1bc + 1) {
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])
                  (local_228,in_RDI,(long)local_1bc,(long)local_1bc);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])
                  (local_268,in_RDI,(long)local_18,(long)local_1bc);
        std::conj<long_double>((complex<long_double> *)in_RDI);
        std::operator*((complex<long_double> *)CONCAT62(in_stack_fffffffffffffcc2,uVar9),pcVar8);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])
                  (local_288,in_RDI,(long)local_18c,(long)local_1bc);
        std::operator*((complex<long_double> *)CONCAT62(in_stack_fffffffffffffcc2,uVar9),pcVar8);
        std::complex<long_double>::operator+=
                  ((complex<long_double> *)CONCAT62(in_stack_fffffffffffffcc2,uVar9),pcVar8);
      }
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])
                (&stack0xfffffffffffffd18,in_RDI,(long)local_18c,(long)local_18);
      std::operator-((complex<long_double> *)CONCAT62(in_stack_fffffffffffffcc2,uVar9),pcVar8);
      std::operator/((complex<long_double> *)CONCAT62(in_stack_fffffffffffffcc2,uVar9),pcVar8);
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])
                (in_RDI,(long)local_18c,(long)local_18,local_2a8);
      std::conj<long_double>((complex<long_double> *)in_RDI);
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])
                (in_RDI,(long)local_18,(long)local_18c,local_2a8);
      iVar2 = local_18c;
    }
  }
  in_RDI->fDecomposed = '\x04';
  in_RDI->fDefPositive = '\0';
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Decompose_LDLt() {
	
	if (  fDecomposed && fDecomposed != ELDLt) {
		Error( "Decompose_LDLt <Matrix already Decomposed with other scheme> " );
	} else if(fDecomposed ) {
		return ELDLt;
	}
	if ( Rows()!=Cols() ) Error( "Decompose_LDLt <Matrix must be square>" );
	
	const int dim=Rows();
	
	for (auto j = 0; j < dim; j++ ) {
        TVar sum = 0;
		for (auto k=0; k<j; k++) {
            if constexpr(is_complex<TVar>::value){
                sum +=GetVal(k,k)*std::conj(GetVal(k,j))*GetVal(k,j);
            }else{
                sum +=GetVal(k,k)*GetVal(k,j)*GetVal(k,j);
            }   
		}
        PutVal( j,j,GetVal(j,j) - sum );
		TVar tmp = GetVal(j,j);
		if ( IsZero(tmp) ) Error( "Decompose_LDLt <Zero on diagonal>" );
        for(auto l=j+1; l<dim;l++) {
            TVar sum = 0;
            for (auto k=0; k<j; k++) {
                if constexpr(is_complex<TVar>::value){
                    sum += GetVal(k,k)*std::conj(GetVal(j,k))*GetVal(l,k);
                }else{
                    sum += GetVal(k,k)*GetVal(j,k)*GetVal(l,k);
                }
			}
            TVar val = (GetVal(l,j) - sum)/tmp;
            PutVal(l,j,val);
            if constexpr(is_complex<TVar>::value){val=std::conj(val);}
            PutVal(j,l,val);
		}
	}
	fDecomposed  = ELDLt;
	fDefPositive = 0;
	return( 1 );
}